

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O0

void dic_reinsert_when_resizing(dictionary *dic,keynode *k2)

{
  uint32_t uVar1;
  uint uVar2;
  keynode *k;
  int n;
  keynode *k2_local;
  dictionary *dic_local;
  
  uVar1 = meiyan(k2->key,(uint)k2->len);
  uVar2 = uVar1 % (uint)dic->length;
  if (dic->table[(int)uVar2] == (keynode *)0x0) {
    dic->table[(int)uVar2] = k2;
    dic->value = &dic->table[(int)uVar2]->value;
  }
  else {
    k2->next = dic->table[(int)uVar2];
    dic->table[(int)uVar2] = k2;
    dic->value = &k2->value;
  }
  return;
}

Assistant:

void dic_reinsert_when_resizing(struct dictionary* dic, struct keynode *k2) {
	int n = hash_func(k2->key, k2->len) % dic->length;
	if (dic->table[n] == 0) {
		dic->table[n] = k2;
		dic->value = &dic->table[n]->value;
		return;
	}
	struct keynode *k = dic->table[n];
	k2->next = k;
	dic->table[n] = k2;
	dic->value = &k2->value;
}